

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O2

void __thiscall dynet::EGTrainer::update_params(EGTrainer *this,real gscale,size_t idx)

{
  ParameterStorage *pPVar1;
  ParameterCollectionStorage *pPVar2;
  initializer_list<dynet::Tensor_*> __l;
  allocator_type local_55;
  real local_54;
  _Vector_base<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_> local_50;
  Tensor *local_38;
  Tensor *local_30;
  pointer local_28;
  Tensor *local_20;
  Tensor *local_18;
  
  local_54 = gscale;
  pPVar2 = ParameterCollection::get_storage((this->super_Trainer).model);
  pPVar1 = (pPVar2->params).
           super__Vector_base<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>
           ._M_impl.super__Vector_impl_data._M_start[idx];
  local_38 = &pPVar1->values;
  local_30 = &pPVar1->g;
  local_28 = (this->hp).
             super__Vector_base<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>.
             _M_impl.super__Vector_impl_data._M_start + idx;
  local_20 = &this->meg;
  local_18 = &this->zeg;
  __l._M_len = 5;
  __l._M_array = &local_38;
  std::vector<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_>::vector
            ((vector<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_> *)&local_50,__l,&local_55);
  (*(this->super_Trainer)._vptr_Trainer[5])(local_54,this,&local_50);
  std::_Vector_base<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_>::~_Vector_base(&local_50);
  return;
}

Assistant:

void EGTrainer::update_params(real gscale, size_t idx) {
  auto & p = model->parameters_list()[idx];
  update_rule(gscale, {&p->values, &p->g, &hp[idx].h, &meg, &zeg});
}